

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spake25519.cc
# Opt level: O0

void update_with_length_prefix(SHA512_CTX *sha,uint8_t *data,size_t len)

{
  uint local_34;
  size_t sStack_30;
  uint i;
  size_t l;
  uint8_t len_le [8];
  size_t len_local;
  uint8_t *data_local;
  SHA512_CTX *sha_local;
  
  sStack_30 = len;
  for (local_34 = 0; local_34 < 8; local_34 = local_34 + 1) {
    len_le[(ulong)local_34 - 8] = (uint8_t)sStack_30;
    sStack_30 = sStack_30 >> 8;
  }
  len_le = (uint8_t  [8])len;
  SHA512_Update((SHA512_CTX *)sha,&l,8);
  SHA512_Update((SHA512_CTX *)sha,data,(size_t)len_le);
  return;
}

Assistant:

static void update_with_length_prefix(SHA512_CTX *sha, const uint8_t *data,
                                      const size_t len) {
  uint8_t len_le[8];
  size_t l = len;
  unsigned i;

  for (i = 0; i < 8; i++) {
    len_le[i] = l & 0xff;
    l >>= 8;
  }

  SHA512_Update(sha, len_le, sizeof(len_le));
  SHA512_Update(sha, data, len);
}